

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O0

LIndex IndexTools::IndividualToJointIndicesStepSize
                 (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *indices,
                 LIndex *step_size)

{
  size_type sVar1;
  const_reference pvVar2;
  long in_RSI;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_RDI;
  Index i;
  LIndex jointI;
  size_t vec_size;
  undefined4 local_24;
  undefined8 local_20;
  
  sVar1 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size(in_RDI);
  local_20 = 0;
  for (local_24 = 0; local_24 < sVar1; local_24 = local_24 + 1) {
    pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (in_RDI,(ulong)local_24);
    local_20 = *pvVar2 * *(long *)(in_RSI + (ulong)local_24 * 8) + local_20;
  }
  return local_20;
}

Assistant:

LIndex IndexTools::IndividualToJointIndicesStepSize(const vector<LIndex>& indices,
        const LIndex * step_size) 
{
    size_t vec_size = indices.size();

    LIndex jointI = 0;
    for(Index i=0; i < vec_size ; i++)            
        jointI += indices[i] * step_size[i];

    return(jointI);
}